

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall Socket::getPeerName(Socket *this,uint32 *ip,uint16 *port)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  socklen_t local_3c;
  undefined1 local_38 [4];
  socklen_t len;
  sockaddr_in addr;
  uint16 *port_local;
  uint32 *ip_local;
  Socket *this_local;
  
  local_3c = 0x10;
  addr.sin_zero = (uchar  [8])port;
  iVar2 = getpeername(this->s,(sockaddr *)local_38,&local_3c);
  if (iVar2 == 0) {
    uVar3 = ntohl(len);
    *ip = uVar3;
    uVar1 = ntohs(local_38._2_2_);
    *(uint16_t *)addr.sin_zero = uVar1;
  }
  return iVar2 == 0;
}

Assistant:

bool Socket::getPeerName(uint32& ip, uint16& port)
{
  sockaddr_in addr;
  socklen_t len = sizeof(addr);
  if(getpeername(s, (sockaddr*)&addr, &len) != 0)
    return false;
  ip = ntohl(addr.sin_addr.s_addr);
  port = ntohs(addr.sin_port);
  return true;
}